

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ImplicitWeakMessage::ImplicitWeakMessage
          (ImplicitWeakMessage *this,Arena *arena)

{
  ClassData *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Arena *arena_local;
  ImplicitWeakMessage *this_local;
  
  pCVar1 = ClassDataLite<1UL>::base((ClassDataLite<1UL> *)class_data_);
  MessageLite::MessageLite(&this->super_MessageLite,arena,pCVar1);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_0082b610;
  pbVar2 = Arena::Create<std::__cxx11::string>(arena);
  this->data_ = pbVar2;
  CachedSize::CachedSize(&this->cached_size_);
  return;
}

Assistant:

explicit ImplicitWeakMessage(Arena* arena)
      : MessageLite(arena, class_data_.base()),
        data_(Arena::Create<std::string>(arena)) {}